

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int print_pkey(EVP_PKEY *pkey,BIO *out,int indent,int selection,char *propquery,
              _func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *legacy_print,ASN1_PCTX *legacy_pctx)

{
  int iVar1;
  OSSL_ENCODER_CTX *kstr;
  undefined8 in_RSI;
  BIO *in_RDI;
  code *in_R9;
  undefined8 in_stack_00000008;
  int ret;
  OSSL_ENCODER_CTX *ctx;
  long saved_indent;
  int pop_f_prefix;
  char *in_stack_00000058;
  char *in_stack_00000068;
  int in_stack_00000074;
  EVP_PKEY *in_stack_00000078;
  OSSL_ENCODER_CTX *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  EVP_PKEY *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = -2;
  iVar1 = print_set_indent((BIO **)in_stack_ffffffffffffffc8,
                           (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (long *)0x0,CONCAT44(0xfffffffe,in_stack_ffffffffffffffb0));
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  else {
    kstr = OSSL_ENCODER_CTX_new_for_pkey
                     (in_stack_00000078,in_stack_00000074,in_stack_00000068,(char *)legacy_pctx,
                      in_stack_00000058);
    iVar1 = OSSL_ENCODER_CTX_get_num_encoders(in_stack_ffffffffffffffa8);
    if (iVar1 != 0) {
      iVar2 = OSSL_ENCODER_to_bio((OSSL_ENCODER_CTX *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI);
    }
    OSSL_ENCODER_CTX_free((OSSL_ENCODER_CTX *)0x276140);
    if (iVar2 == -2) {
      if (in_R9 == (code *)0x0) {
        iVar2 = unsup_alg((BIO *)0x0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                          (char *)kstr);
      }
      else {
        iVar2 = (*in_R9)(in_RSI,in_RDI,0,in_stack_00000008);
      }
    }
    print_reset_indent((BIO **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int)((ulong)kstr >> 0x20),CONCAT44(iVar2,in_stack_ffffffffffffffb0));
  }
  return iVar2;
}

Assistant:

static int print_pkey(const EVP_PKEY *pkey, BIO *out, int indent,
                      int selection /* For provided encoding */,
                      const char *propquery /* For provided encoding */,
                      int (*legacy_print)(BIO *out, const EVP_PKEY *pkey,
                                          int indent, ASN1_PCTX *pctx),
                      ASN1_PCTX *legacy_pctx /* For legacy print */)
{
    int pop_f_prefix;
    long saved_indent;
    OSSL_ENCODER_CTX *ctx = NULL;
    int ret = -2;                /* default to unsupported */

    if (!print_set_indent(&out, &pop_f_prefix, &saved_indent, indent))
        return 0;

    ctx = OSSL_ENCODER_CTX_new_for_pkey(pkey, selection, "TEXT", NULL,
                                        propquery);
    if (OSSL_ENCODER_CTX_get_num_encoders(ctx) != 0)
        ret = OSSL_ENCODER_to_bio(ctx, out);
    OSSL_ENCODER_CTX_free(ctx);

    if (ret != -2)
        goto end;

    /* legacy fallback */
    if (legacy_print != NULL)
        ret = legacy_print(out, pkey, 0, legacy_pctx);
    else
        ret = unsup_alg(out, pkey, 0, "Public Key");

 end:
    print_reset_indent(&out, pop_f_prefix, saved_indent);
    return ret;
}